

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h262_slice.c
# Opt level: O0

int h262_infer_vectors(bitstream *str,h262_seqparm *seqparm,h262_picparm *picparm,
                      h262_macroblock *mb,int s)

{
  int iVar1;
  bitstream *in_RCX;
  long in_RDX;
  int in_R8D;
  int bottom;
  uint32_t in_stack_ffffffffffffffcc;
  uint in_stack_ffffffffffffffd0;
  int local_4;
  
  if (*(int *)(in_RDX + 0x34) != 3) {
    in_stack_ffffffffffffffd0 = (uint)(*(int *)(in_RDX + 0x34) == 2);
    iVar1 = vs_infer(in_RCX,(uint32_t *)CONCAT44(in_R8D,in_stack_ffffffffffffffd0),
                     in_stack_ffffffffffffffcc);
    if (iVar1 != 0) {
      return 1;
    }
    iVar1 = vs_infer(in_RCX,(uint32_t *)CONCAT44(in_R8D,in_stack_ffffffffffffffd0),
                     in_stack_ffffffffffffffcc);
    if (iVar1 != 0) {
      return 1;
    }
  }
  iVar1 = vs_infer(in_RCX,(uint32_t *)CONCAT44(in_R8D,in_stack_ffffffffffffffd0),
                   in_stack_ffffffffffffffcc);
  if (iVar1 == 0) {
    iVar1 = vs_infer(in_RCX,(uint32_t *)CONCAT44(in_R8D,in_stack_ffffffffffffffd0),
                     in_stack_ffffffffffffffcc);
    if (iVar1 == 0) {
      iVar1 = vs_infer(in_RCX,(uint32_t *)CONCAT44(in_R8D,in_stack_ffffffffffffffd0),
                       in_stack_ffffffffffffffcc);
      if (iVar1 == 0) {
        iVar1 = vs_infer(in_RCX,(uint32_t *)CONCAT44(in_R8D,in_stack_ffffffffffffffd0),
                         in_stack_ffffffffffffffcc);
        if (iVar1 == 0) {
          iVar1 = vs_infer(in_RCX,(uint32_t *)CONCAT44(in_R8D,in_stack_ffffffffffffffd0),
                           in_stack_ffffffffffffffcc);
          if (iVar1 == 0) {
            iVar1 = vs_infer(in_RCX,(uint32_t *)CONCAT44(in_R8D,in_stack_ffffffffffffffd0),
                             in_stack_ffffffffffffffcc);
            if (iVar1 == 0) {
              iVar1 = vs_infer(in_RCX,(uint32_t *)CONCAT44(in_R8D,in_stack_ffffffffffffffd0),
                               in_stack_ffffffffffffffcc);
              if (iVar1 == 0) {
                iVar1 = vs_infer(in_RCX,(uint32_t *)CONCAT44(in_R8D,in_stack_ffffffffffffffd0),
                                 in_stack_ffffffffffffffcc);
                if (iVar1 == 0) {
                  if (in_R8D == 0) {
                    iVar1 = vs_infer(in_RCX,(uint32_t *)(ulong)in_stack_ffffffffffffffd0,
                                     in_stack_ffffffffffffffcc);
                    if (iVar1 != 0) {
                      return 1;
                    }
                    iVar1 = vs_infer(in_RCX,(uint32_t *)CONCAT44(in_R8D,in_stack_ffffffffffffffd0),
                                     in_stack_ffffffffffffffcc);
                    if (iVar1 != 0) {
                      return 1;
                    }
                  }
                  local_4 = 0;
                }
                else {
                  local_4 = 1;
                }
              }
              else {
                local_4 = 1;
              }
            }
            else {
              local_4 = 1;
            }
          }
          else {
            local_4 = 1;
          }
        }
        else {
          local_4 = 1;
        }
      }
      else {
        local_4 = 1;
      }
    }
    else {
      local_4 = 1;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int h262_infer_vectors(struct bitstream *str, struct h262_seqparm *seqparm, struct h262_picparm *picparm, struct h262_macroblock *mb, int s) {
	if (picparm->picture_structure != H262_PIC_STRUCT_FRAME) {
		int bottom = picparm->picture_structure == H262_PIC_STRUCT_FIELD_BOTTOM;
		if (vs_infer(str, &mb->motion_vertical_field_select[s][0], bottom)) return 1;
		if (vs_infer(str, &mb->motion_vertical_field_select[s][1], bottom)) return 1;
	}
	if (vs_infer(str, &mb->motion_code[0][s][0], 0)) return 1;
	if (vs_infer(str, &mb->motion_code[0][s][1], 0)) return 1;
	if (vs_infer(str, &mb->motion_code[1][s][0], 0)) return 1;
	if (vs_infer(str, &mb->motion_code[1][s][1], 0)) return 1;
	if (vs_infer(str, &mb->motion_residual[0][s][0], 0)) return 1;
	if (vs_infer(str, &mb->motion_residual[0][s][1], 0)) return 1;
	if (vs_infer(str, &mb->motion_residual[1][s][0], 0)) return 1;
	if (vs_infer(str, &mb->motion_residual[1][s][1], 0)) return 1;
	if (!s) {
		if (vs_infer(str, &mb->dmvector[0], 0)) return 1;
		if (vs_infer(str, &mb->dmvector[1], 0)) return 1;
	}
	return 0;
}